

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

RawBrandedSchema * __thiscall
capnp::SchemaLoader::Impl::makeBranded
          (Impl *this,RawSchema *schema,ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> bindings)

{
  SchemaBindingsPair key_00;
  size_t sVar1;
  RawBrandedSchema *value;
  Scope *pSVar2;
  RawBrandedSchema *brand;
  RawBrandedSchema **existing;
  RawBrandedSchema **local_48;
  RawBrandedSchema **_existing1519;
  SchemaBindingsPair key;
  RawSchema *schema_local;
  Impl *this_local;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> bindings_local;
  
  bindings_local.ptr = (Scope *)bindings.size_;
  this_local = (Impl *)bindings.ptr;
  key.scopeBindings = (Scope *)schema;
  sVar1 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>::size
                    ((ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *)&this_local);
  if (sVar1 == 0) {
    bindings_local.size_ = (size_t)(key.scopeBindings + 3);
  }
  else {
    _existing1519 = (RawBrandedSchema **)key.scopeBindings;
    key.schema = (RawSchema *)
                 kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>::begin
                           ((ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *)&this_local);
    kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::
    find<capnp::(anonymous_namespace)::SchemaBindingsPair&>
              ((HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>
                *)&existing,(SchemaBindingsPair *)&this->brands);
    local_48 = kj::_::readMaybe<capnp::_::RawBrandedSchema*>
                         ((Maybe<capnp::_::RawBrandedSchema_*&> *)&existing);
    if (local_48 == (RawBrandedSchema **)0x0) {
      value = kj::Arena::allocate<capnp::_::RawBrandedSchema>(&this->arena);
      memset(value,0,0x28);
      key_00.scopeBindings = (Scope *)key.schema;
      key_00.schema = (RawSchema *)_existing1519;
      kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::
      insert(&this->brands,key_00,value);
      value->generic = (RawSchema *)key.scopeBindings;
      pSVar2 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>::begin
                         ((ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *)&this_local);
      value->scopes = pSVar2;
      sVar1 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>::size
                        ((ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *)&this_local);
      value->scopeCount = (uint32_t)sVar1;
      value->lazyInitializer = &(this->brandedInitializer).super_Initializer;
      bindings_local.size_ = (size_t)value;
    }
    else {
      bindings_local.size_ = (size_t)*local_48;
    }
  }
  return (RawBrandedSchema *)bindings_local.size_;
}

Assistant:

const _::RawBrandedSchema* SchemaLoader::Impl::makeBranded(
    const _::RawSchema* schema, kj::ArrayPtr<const _::RawBrandedSchema::Scope> bindings) {
  if (bindings.size() == 0) {
    // `defaultBrand` is the version where all type parameters are bound to `AnyPointer`.
    return &schema->defaultBrand;
  }

  SchemaBindingsPair key { schema, bindings.begin() };
  KJ_IF_SOME(existing, brands.find(key)) {
    return existing;
  } else {
    auto& brand = arena.allocate<_::RawBrandedSchema>();
    memset(&brand, 0, sizeof(brand));
    brands.insert(key, &brand);

    brand.generic = schema;
    brand.scopes = bindings.begin();
    brand.scopeCount = bindings.size();
    brand.lazyInitializer = &brandedInitializer;
    return &brand;
  }